

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O2

void duckdb::HistogramBinFinalizeFunction<duckdb::HistogramFunctor,signed_char>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  long *plVar1;
  long *plVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  bool bVar5;
  idx_t bin_idx;
  idx_t size;
  LogicalType *type;
  Vector *this;
  Vector *pVVar6;
  ulong uVar7;
  idx_t iVar8;
  long *plVar9;
  idx_t iVar10;
  idx_t i_1;
  ulong uVar11;
  long lVar12;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat local_b8;
  Value local_70;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_b8);
  Vector::ToUnifiedFormat(state_vector,count,&local_b8);
  FlatVector::VerifyFlatVector(result);
  size = ListVector::GetListSize(result);
  type = MapType::KeyType(&result->type);
  bVar5 = SupportsOtherBucket(type);
  lVar12 = 0;
  for (iVar8 = 0; count != iVar8; iVar8 = iVar8 + 1) {
    iVar10 = iVar8;
    if ((local_b8.sel)->sel_vector != (sel_t *)0x0) {
      iVar10 = (idx_t)(local_b8.sel)->sel_vector[iVar8];
    }
    plVar2 = (long *)**(long **)(local_b8.data + iVar10 * 8);
    if (plVar2 != (long *)0x0) {
      lVar12 = (ulong)(*(long *)(*(long *)((*(long **)(local_b8.data + iVar10 * 8))[1] + 8) + -8) !=
                       0 && bVar5) + (plVar2[1] - *plVar2) + lVar12;
    }
  }
  ListVector::Reserve(result,lVar12 + size);
  this = MapVector::GetKeys(result);
  pVVar6 = MapVector::GetValues(result);
  pdVar3 = result->data;
  pdVar4 = pVVar6->data;
  for (uVar11 = 0; uVar11 != count; uVar11 = uVar11 + 1) {
    uVar7 = uVar11;
    if ((local_b8.sel)->sel_vector != (sel_t *)0x0) {
      uVar7 = (ulong)(local_b8.sel)->sel_vector[uVar11];
    }
    plVar2 = *(long **)(local_b8.data + uVar7 * 8);
    plVar9 = (long *)*plVar2;
    if (plVar9 == (long *)0x0) {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,uVar11 + offset);
    }
    else {
      lVar12 = (uVar11 + offset) * 0x10;
      plVar1 = (long *)(pdVar3 + lVar12);
      *(idx_t *)(pdVar3 + lVar12) = size;
      for (uVar7 = 0; uVar7 < (ulong)(plVar9[1] - *plVar9); uVar7 = uVar7 + 1) {
        this->data[size] = *(data_t *)(*plVar9 + uVar7);
        *(undefined8 *)(pdVar4 + size * 8) = *(undefined8 *)(*(long *)plVar2[1] + uVar7 * 8);
        size = size + 1;
        plVar9 = (long *)*plVar2;
      }
      if (bVar5 && *(long *)(*(long *)(plVar2[1] + 8) + -8) != 0) {
        OtherBucketValue(&local_70,&this->type);
        Vector::SetValue(this,size,&local_70);
        Value::~Value(&local_70);
        *(undefined8 *)(pdVar4 + size * 8) = *(undefined8 *)(*(long *)(plVar2[1] + 8) + -8);
        size = size + 1;
      }
      plVar1[1] = size - *plVar1;
    }
  }
  ListVector::SetListSize(result,size);
  Vector::Verify(result,count);
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_b8);
  return;
}

Assistant:

static void HistogramBinFinalizeFunction(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count,
                                         idx_t offset) {
	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);
	auto states = UnifiedVectorFormat::GetData<HistogramBinState<T> *>(sdata);

	auto &mask = FlatVector::Validity(result);
	auto old_len = ListVector::GetListSize(result);
	idx_t new_entries = 0;
	bool supports_other_bucket = SupportsOtherBucket(MapType::KeyType(result.GetType()));
	// figure out how much space we need
	for (idx_t i = 0; i < count; i++) {
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.bin_boundaries) {
			continue;
		}
		new_entries += state.bin_boundaries->size();
		if (state.counts->back() > 0 && supports_other_bucket) {
			// overflow bucket has entries
			new_entries++;
		}
	}
	// reserve space in the list vector
	ListVector::Reserve(result, old_len + new_entries);
	auto &keys = MapVector::GetKeys(result);
	auto &values = MapVector::GetValues(result);
	auto list_entries = FlatVector::GetData<list_entry_t>(result);
	auto count_entries = FlatVector::GetData<uint64_t>(values);

	idx_t current_offset = old_len;
	for (idx_t i = 0; i < count; i++) {
		const auto rid = i + offset;
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.bin_boundaries) {
			mask.SetInvalid(rid);
			continue;
		}

		auto &list_entry = list_entries[rid];
		list_entry.offset = current_offset;
		for (idx_t bin_idx = 0; bin_idx < state.bin_boundaries->size(); bin_idx++) {
			OP::template HistogramFinalize<T>((*state.bin_boundaries)[bin_idx], keys, current_offset);
			count_entries[current_offset] = (*state.counts)[bin_idx];
			current_offset++;
		}
		if (state.counts->back() > 0 && supports_other_bucket) {
			// add overflow bucket ("others")
			// set bin boundary to NULL for overflow bucket
			keys.SetValue(current_offset, OtherBucketValue(keys.GetType()));
			count_entries[current_offset] = state.counts->back();
			current_offset++;
		}
		list_entry.length = current_offset - list_entry.offset;
	}
	D_ASSERT(current_offset == old_len + new_entries);
	ListVector::SetListSize(result, current_offset);
	result.Verify(count);
}